

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::format_decimal<unsigned_long,char,fmt::v5::internal::no_thousands_sep>
                 (long buffer,ulong value,int num_digits)

{
  long lVar1;
  uint index;
  uint index_1;
  char *end;
  ulong uStack_28;
  int num_digits_local;
  unsigned_long value_local;
  char *buffer_local;
  
  if (num_digits < 0) {
    __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x3c0,
                  "Char *fmt::internal::format_decimal(Char *, UInt, int, ThousandsSep) [UInt = unsigned long, Char = char, ThousandsSep = fmt::internal::no_thousands_sep]"
                 );
  }
  uStack_28 = value;
  value_local = (unsigned_long)(buffer + num_digits);
  while (99 < uStack_28) {
    lVar1 = (uStack_28 % 100) * 2;
    uStack_28 = uStack_28 / 100;
    *(undefined1 *)(value_local - 1) = basic_data<void>::DIGITS[(int)lVar1 + 1];
    no_thousands_sep::operator()
              ((no_thousands_sep *)((long)&buffer_local + 7),(char *)(value_local - 1));
    *(undefined1 *)(value_local - 2) = basic_data<void>::DIGITS[lVar1];
    no_thousands_sep::operator()
              ((no_thousands_sep *)((long)&buffer_local + 7),(char *)(value_local - 2));
    value_local = value_local - 2;
  }
  if (uStack_28 < 10) {
    *(char *)(value_local - 1) = (char)uStack_28 + '0';
  }
  else {
    *(undefined1 *)(value_local - 1) = basic_data<void>::DIGITS[(int)(uStack_28 << 1) + 1];
    no_thousands_sep::operator()
              ((no_thousands_sep *)((long)&buffer_local + 7),(char *)(value_local - 1));
    *(undefined1 *)(value_local - 2) = basic_data<void>::DIGITS[uStack_28 << 1 & 0xffffffff];
  }
  return (char *)(buffer + num_digits);
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}